

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_run(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  GCstr *pGVar3;
  TValue *pTVar4;
  uint *puVar5;
  ulong uVar6;
  TValue *pTVar7;
  void *pvVar8;
  long lVar9;
  
  uVar2 = (ulong)(L->glref).ptr32;
  if (*(int *)(uVar2 + 400) == 0) {
    pTVar4 = L->base + -1;
    pTVar7 = (TValue *)(ulong)(L->stack).ptr32;
    pvVar8 = L->cframe;
    if (pvVar8 != (void *)0x0 && pTVar7 < pTVar4) {
LAB_0010f001:
      do {
        if ((*(int *)(((ulong)pvVar8 & 0xfffffffffffffffc) + 0x10) < 0) &&
           (pTVar4 < (TValue *)((long)pTVar7 - (long)*(int *)((long)pvVar8 + 0x10)))) {
          lVar9 = (long)*(int *)((long)pvVar8 + 0x14);
          if (lVar9 < 0) goto code_r0x0010f02b;
          goto LAB_0010f0cc;
        }
        uVar1 = (pTVar4->field_2).it;
        switch(uVar1 & 7) {
        default:
          pTVar4 = pTVar4 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
          goto LAB_0010f095;
        case 1:
          pvVar8 = *(void **)((long)pvVar8 + 0x30);
        case 3:
          pTVar4 = (TValue *)((long)pTVar4 - (long)(int)(uVar1 & 0xfffffff8));
LAB_0010f095:
          if (pTVar4 <= pTVar7) goto LAB_0010f0c9;
          lVar9 = 0;
          if (pvVar8 == (void *)0x0) goto LAB_0010f0cc;
          break;
        case 2:
          if (pTVar4[-1].u32.lo == 1) goto LAB_0010f07a;
          goto LAB_0010f07e;
        case 5:
          if (((ulong)pvVar8 & 1) == 0) {
            lVar9 = (long)*(int *)((long)pvVar8 + 0x14);
            if (lVar9 < 0) {
LAB_0010f07a:
              pvVar8 = *(void **)((long)pvVar8 + 0x30);
LAB_0010f07e:
              pTVar4 = (TValue *)((long)pTVar4 - ((long)(int)uVar1 & 0xfffffffffffffff8U));
              goto LAB_0010f095;
            }
            goto LAB_0010f0cc;
          }
          goto LAB_0010f0c9;
        case 6:
        case 7:
          puVar5 = (uint *)((long)pTVar4 - (long)(int)(uVar1 & 0xfffffff8));
          if (*(char *)((ulong)*puVar5 + 6) == '\x15') {
            lVar9 = (long)puVar5 + (8 - (long)pTVar7);
            goto LAB_0010f0cc;
          }
          goto LAB_0010f0c9;
        }
      } while( true );
    }
  }
LAB_0010f0c9:
  lVar9 = 0;
LAB_0010f0cc:
  if (lVar9 != 0) {
    uVar6 = (ulong)(L->stack).ptr32;
    pTVar4 = L->top;
    puVar5 = (uint *)(uVar2 + 0x31c);
    *puVar5 = *puVar5 & 0xffffffef;
    if ((*(int *)(uVar6 + 4 + lVar9) != -9) || (L->status == '\x05')) {
      pGVar3 = lj_err_str(L,LJ_ERR_ERRERR);
      pTVar4[-1].u32.lo = (uint32_t)pGVar3;
      *(undefined4 *)((long)pTVar4 + -4) = 0xfffffffb;
      lj_err_throw(L,5);
    }
    L->status = '\x05';
    *pTVar4 = pTVar4[-1];
    pTVar4[-1] = *(TValue *)(uVar6 + lVar9);
    L->top = pTVar4 + 1;
    lj_vm_call(L,pTVar4,2);
  }
  lj_err_throw(L,2);
code_r0x0010f02b:
  pvVar8 = *(void **)((long)pvVar8 + 0x30);
  if (pvVar8 == (void *)0x0) goto LAB_0010f0c9;
  goto LAB_0010f001;
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}